

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSkeletonAnimationTrack
          (OgreBinarySerializer *this,Skeleton *param_1,Animation *dest)

{
  bool bVar1;
  DeadlyImportError *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar2;
  basic_formatter *this_01;
  uint16_t local_24a;
  undefined1 local_248 [6];
  uint16_t id;
  VertexAnimationTrack track;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_50;
  Bone *local_30;
  Bone *bone;
  Animation *pAStack_20;
  uint16_t boneId;
  Animation *dest_local;
  Skeleton *param_1_local;
  OgreBinarySerializer *this_local;
  
  pAStack_20 = dest;
  dest_local = (Animation *)param_1;
  param_1_local = (Skeleton *)this;
  bone._6_2_ = Read<unsigned_short>(this);
  local_30 = Skeleton::BoneById(pAStack_20->parentSkeleton,bone._6_2_);
  if (local_30 == (Bone *)0x0) {
    track.transformKeyFrames.
    super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              (&local_1c8);
    pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_1c8,(char (*) [42])"Cannot read animation track, target bone ");
    pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar2,(unsigned_short *)((long)&bone + 6));
    this_01 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator<<(pbVar2,(char (*) [24])" not in target Skeleton");
    Formatter::basic_formatter::operator_cast_to_string(&local_50,this_01);
    DeadlyImportError::DeadlyImportError(this_00,&local_50);
    track.transformKeyFrames.
    super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  VertexAnimationTrack::VertexAnimationTrack((VertexAnimationTrack *)local_248);
  local_248._0_4_ = VAT_TRANSFORM;
  std::__cxx11::string::operator=((string *)&track,(string *)&local_30->name);
  local_24a = ReadHeader(this,true);
  while (bVar1 = AtEnd(this), !bVar1 && local_24a == 0x4110) {
    ReadSkeletonAnimationKeyFrame(this,(VertexAnimationTrack *)local_248);
    bVar1 = AtEnd(this);
    if (!bVar1) {
      local_24a = ReadHeader(this,true);
    }
  }
  bVar1 = AtEnd(this);
  if (!bVar1) {
    RollbackHeader(this);
  }
  std::
  vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>::
  push_back(&pAStack_20->tracks,(value_type *)local_248);
  VertexAnimationTrack::~VertexAnimationTrack((VertexAnimationTrack *)local_248);
  return;
}

Assistant:

void OgreBinarySerializer::ReadSkeletonAnimationTrack(Skeleton * /*skeleton*/, Animation *dest)
{
    uint16_t boneId = Read<uint16_t>();
    Bone *bone = dest->parentSkeleton->BoneById(boneId);
    if (!bone) {
        throw DeadlyImportError(Formatter::format() << "Cannot read animation track, target bone " << boneId << " not in target Skeleton");
    }

    VertexAnimationTrack track;
    track.type = VertexAnimationTrack::VAT_TRANSFORM;
    track.boneName = bone->name;

    uint16_t id = ReadHeader();
    while (!AtEnd() && id == SKELETON_ANIMATION_TRACK_KEYFRAME)
    {
        ReadSkeletonAnimationKeyFrame(&track);

        if (!AtEnd())
            id = ReadHeader();
    }
    if (!AtEnd())
        RollbackHeader();

    dest->tracks.push_back(track);
}